

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayout::fitLayout(QDockAreaLayout *this)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QLayoutStruct> local_78;
  QArrayDataPointer<QLayoutStruct> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_58,3);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_78,3);
  getGrid(this,(QList<QLayoutStruct> *)&local_58,(QList<QLayoutStruct> *)&local_78);
  iVar1 = (this->rect).y1.m_i;
  qGeomCalc((QList<QLayoutStruct> *)&local_58,0,3,iVar1,((this->rect).y2.m_i - iVar1) + 1,this->sep)
  ;
  iVar1 = (this->rect).x1.m_i;
  qGeomCalc((QList<QLayoutStruct> *)&local_78,0,3,iVar1,((this->rect).x2.m_i - iVar1) + 1,this->sep)
  ;
  setGrid(this,(QList<QLayoutStruct> *)&local_58,(QList<QLayoutStruct> *)&local_78);
  QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::fitLayout()
{
    QList<QLayoutStruct> ver_struct_list(3);
    QList<QLayoutStruct> hor_struct_list(3);
    getGrid(&ver_struct_list, &hor_struct_list);

    qGeomCalc(ver_struct_list, 0, 3, rect.top(), rect.height(), sep);
    qGeomCalc(hor_struct_list, 0, 3, rect.left(), rect.width(), sep);

    setGrid(&ver_struct_list, &hor_struct_list);
}